

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

int32_t zng_gzputc(gzFile file,int c)

{
  int iVar1;
  size_t sVar2;
  uint in_ESI;
  size_t in_RDI;
  zng_stream *strm;
  gz_state *state;
  uchar buf [1];
  uint have;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  uint in_stack_ffffffffffffffe8;
  uint local_4;
  
  if (in_RDI == 0) {
    local_4 = 0xffffffff;
  }
  else if ((*(int *)(in_RDI + 0x18) == 0x79b1) && (*(int *)(in_RDI + 0x74) == 0)) {
    sVar2 = in_RDI;
    if (*(int *)(in_RDI + 0x70) != 0) {
      *(undefined4 *)(in_RDI + 0x70) = 0;
      iVar1 = gz_zero((gz_state *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                      CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
      if (iVar1 == -1) {
        return -1;
      }
    }
    if (*(int *)(sVar2 + 0x28) != 0) {
      if (*(int *)(in_RDI + 0x88) == 0) {
        *(undefined8 *)(in_RDI + 0x80) = *(undefined8 *)(sVar2 + 0x30);
      }
      in_stack_ffffffffffffffe8 =
           ((int)*(undefined8 *)(in_RDI + 0x80) + *(int *)(in_RDI + 0x88)) -
           (int)*(undefined8 *)(sVar2 + 0x30);
      if (in_stack_ffffffffffffffe8 < *(uint *)(sVar2 + 0x28)) {
        *(char *)(*(long *)(sVar2 + 0x30) + (ulong)in_stack_ffffffffffffffe8) = (char)in_ESI;
        *(int *)(in_RDI + 0x88) = *(int *)(in_RDI + 0x88) + 1;
        *(long *)(sVar2 + 0x10) = *(long *)(sVar2 + 0x10) + 1;
        return in_ESI & 0xff;
      }
    }
    sVar2 = gz_write((gz_state *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                     (void *)CONCAT17((char)in_ESI,in_stack_ffffffffffffffe0),sVar2);
    if (sVar2 == 1) {
      local_4 = in_ESI & 0xff;
    }
    else {
      local_4 = 0xffffffff;
    }
  }
  else {
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

int Z_EXPORT PREFIX(gzputc)(gzFile file, int c) {
    unsigned have;
    unsigned char buf[1];
    gz_state *state;
    PREFIX3(stream) *strm;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_state *)file;
    strm = &(state->strm);

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return -1;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return -1;
    }

    /* try writing to input buffer for speed (state->size == 0 if buffer not
       initialized) */
    if (state->size) {
        if (strm->avail_in == 0)
            strm->next_in = state->in;
        have = (unsigned)((strm->next_in + strm->avail_in) - state->in);
        if (have < state->size) {
            state->in[have] = (unsigned char)c;
            strm->avail_in++;
            state->x.pos++;
            return c & 0xff;
        }
    }

    /* no room in buffer or not initialized, use gz_write() */
    buf[0] = (unsigned char)c;
    if (gz_write(state, buf, 1) != 1)
        return -1;
    return c & 0xff;
}